

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.h
# Opt level: O2

void __thiscall
ExpressionInternal::
ExpressionInternal<std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>,std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>>
          (ExpressionInternal *this,OperatorType op,
          unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *parameters,
          unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *parameters_1)

{
  this->type = op;
  (this->children).
  super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->children).
  super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->children).
  super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(__index_type *)
   ((long)&(this->value).
           super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
           super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
           super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
           super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
           super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
           super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier> +
   0x20) = '\0';
  std::
  vector<std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>,std::allocator<std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>>>
  ::emplace_back<std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>>
            ((vector<std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>,std::allocator<std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>>>
              *)&this->children,parameters);
  std::
  vector<std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>,std::allocator<std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>>>
  ::emplace_back<std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>>
            ((vector<std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>,std::allocator<std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>>>
              *)&this->children,parameters_1);
  return;
}

Assistant:

ExpressionInternal(OperatorType op, ARGS... parameters) :
		type(op)
	{
		( children.push_back(std::move(parameters)), ... );
	}